

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O2

bool __thiscall
tinygltf::TinyGLTF::LoadBinaryFromMemory
          (TinyGLTF *this,Model *model,string *err,string *warn,uchar *bytes,uint size,
          string *base_dir,uint check_sections)

{
  uint json_str_length;
  uint uVar1;
  bool bVar2;
  ulong uVar3;
  string jsonString;
  
  if ((((0x13 < size) && (*bytes == 'g')) && (bytes[1] == 'l')) &&
     ((bytes[2] == 'T' && (bytes[3] == 'F')))) {
    json_str_length = *(uint *)(bytes + 0xc);
    uVar3 = (ulong)json_str_length;
    if ((json_str_length + 0x14 <= size && uVar3 != 0) &&
       ((uVar1 = *(uint *)(bytes + 8), uVar1 <= size && (*(int *)(bytes + 0x10) == 0x4e4f534a)))) {
      jsonString._M_dataplus._M_p = (pointer)&jsonString.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&jsonString,bytes + 0x14,bytes + uVar3 + 0x14);
      this->is_binary_ = true;
      this->bin_data_ = bytes + uVar3 + 0x1c;
      this->bin_size_ = (ulong)(uVar1 - (json_str_length + 0x14));
      bVar2 = LoadFromString(this,model,err,warn,(char *)(bytes + 0x14),json_str_length,base_dir,
                             check_sections);
      std::__cxx11::string::~string((string *)&jsonString);
      return bVar2;
    }
  }
  if (err != (string *)0x0) {
    std::__cxx11::string::assign((char *)err);
  }
  return false;
}

Assistant:

bool TinyGLTF::LoadBinaryFromMemory(Model *model, std::string *err,
                                    std::string *warn,
                                    const unsigned char *bytes,
                                    unsigned int size,
                                    const std::string &base_dir,
                                    unsigned int check_sections) {
  if (size < 20) {
    if (err) {
      (*err) = "Too short data size for glTF Binary.";
    }
    return false;
  }

  if (bytes[0] == 'g' && bytes[1] == 'l' && bytes[2] == 'T' &&
      bytes[3] == 'F') {
    // ok
  } else {
    if (err) {
      (*err) = "Invalid magic.";
    }
    return false;
  }

  unsigned int version;       // 4 bytes
  unsigned int length;        // 4 bytes
  unsigned int model_length;  // 4 bytes
  unsigned int model_format;  // 4 bytes;

  // @todo { Endian swap for big endian machine. }
  memcpy(&version, bytes + 4, 4);
  swap4(&version);
  memcpy(&length, bytes + 8, 4);
  swap4(&length);
  memcpy(&model_length, bytes + 12, 4);
  swap4(&model_length);
  memcpy(&model_format, bytes + 16, 4);
  swap4(&model_format);

  // In case the Bin buffer is not present, the size is exactly 20 + size of
  // JSON contents,
  // so use "greater than" operator.
  if ((20 + model_length > size) || (model_length < 1) || (length > size) ||
      (model_format != 0x4E4F534A)) {  // 0x4E4F534A = JSON format.
    if (err) {
      (*err) = "Invalid glTF binary.";
    }
    return false;
  }

  // Extract JSON string.
  std::string jsonString(reinterpret_cast<const char *>(&bytes[20]),
                         model_length);

  is_binary_ = true;
  bin_data_ = bytes + 20 + model_length +
              8;  // 4 bytes (buffer_length) + 4 bytes(buffer_format)
  bin_size_ =
      length - (20 + model_length);  // extract header + JSON scene data.

  bool ret = LoadFromString(model, err, warn,
                            reinterpret_cast<const char *>(&bytes[20]),
                            model_length, base_dir, check_sections);
  if (!ret) {
    return ret;
  }

  return true;
}